

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::printTestRunTotals(ostream *stream,ColourImpl *streamColour,Totals *totals)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ostream *poVar4;
  uint64_t count;
  StringRef label;
  StringRef label_00;
  vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
  columns;
  undefined7 in_stack_fffffffffffffec8;
  char in_stack_fffffffffffffecf;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  Code local_110;
  size_t local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_100;
  pluralise local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  char *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  char *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar1 = (totals->testCases).failed;
  uVar2 = (totals->testCases).failedButOk;
  uVar3 = (totals->testCases).skipped;
  local_130._0_8_ = streamColour;
  if ((totals->testCases).passed + uVar1 + uVar2 + uVar3 == 0) {
    local_130._8_5_ = 0x16;
    ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_130,stream);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"No tests ran\n",0xd);
    if (local_130[0xc] == true) {
      (**(code **)(*(long *)local_130._0_8_ + 0x10))(local_130._0_8_,0);
    }
  }
  else {
    count = (totals->assertions).failed + (totals->assertions).passed +
            (totals->assertions).failedButOk;
    if (((totals->assertions).skipped + count == 0) || ((uVar2 != 0 || uVar1 != 0) || uVar3 != 0)) {
      local_e8.m_count = 0;
      local_e8.m_label.m_start = (char *)0x0;
      local_e8.m_label.m_size = 0;
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      if (local_50 == &local_40) {
        local_120._8_8_ = local_40._8_8_;
        local_130._0_8_ = &local_120;
      }
      else {
        local_130._0_8_ = local_50;
      }
      local_120._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
      local_120._M_local_buf[0] = local_40._M_local_buf[0];
      local_130._8_8_ = local_48;
      local_48 = (char *)0x0;
      local_40._M_local_buf[0] = '\0';
      local_110 = None;
      local_108 = 0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = &local_40;
      anon_unknown_26::SummaryColumn::addRow
                ((SummaryColumn *)local_130,
                 (totals->testCases).failed + (totals->testCases).passed +
                 (totals->testCases).failedButOk + (totals->testCases).skipped);
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,count);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&local_e8,(value_type *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(local_40._M_allocated_capacity._1_7_,
                                          local_40._M_local_buf[0]) + 1);
      }
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"passed","");
      if (local_70 == &local_60) {
        local_120._8_8_ = local_60._8_8_;
        local_130._0_8_ = &local_120;
      }
      else {
        local_130._0_8_ = local_70;
      }
      local_120._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
      local_120._M_local_buf[0] = local_60._M_local_buf[0];
      local_130._8_8_ = local_68;
      local_68 = (char *)0x0;
      local_60._M_local_buf[0] = '\0';
      local_110 = Green;
      local_108 = 0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70 = &local_60;
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,(totals->testCases).passed);
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,(totals->assertions).passed)
      ;
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&local_e8,(value_type *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                          local_60._M_local_buf[0]) + 1);
      }
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"failed","");
      if (local_90 == &local_80) {
        local_120._8_8_ = local_80._8_8_;
        local_130._0_8_ = &local_120;
      }
      else {
        local_130._0_8_ = local_90;
      }
      local_120._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
      local_120._M_local_buf[0] = local_80._M_local_buf[0];
      local_130._8_8_ = local_88;
      local_88 = (char *)0x0;
      local_80._M_local_buf[0] = '\0';
      local_110 = BrightRed;
      local_108 = 0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90 = &local_80;
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,(totals->testCases).failed);
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,(totals->assertions).failed)
      ;
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&local_e8,(value_type *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                          local_80._M_local_buf[0]) + 1);
      }
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"skipped","");
      if (local_b0 == &local_a0) {
        local_120._8_8_ = local_a0._8_8_;
        local_130._0_8_ = &local_120;
      }
      else {
        local_130._0_8_ = local_b0;
      }
      local_120._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
      local_120._M_local_buf[0] = local_a0._M_local_buf[0];
      local_130._8_8_ = local_a8;
      local_a8 = (char *)0x0;
      local_a0._M_local_buf[0] = '\0';
      local_110 = FileName;
      local_108 = 0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0 = &local_a0;
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,(totals->testCases).skipped)
      ;
      anon_unknown_26::SummaryColumn::addRow((SummaryColumn *)local_130,0);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&local_e8,(value_type *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                          local_a0._M_local_buf[0]) + 1);
      }
      local_d0 = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"failed as expected","");
      if (local_d0 == &local_c0) {
        local_120._8_8_ = local_c0._8_8_;
        local_130._0_8_ = &local_120;
      }
      else {
        local_130._0_8_ = local_d0;
      }
      local_120._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
      local_120._M_local_buf[0] = local_c0._M_local_buf[0];
      local_130._8_8_ = local_c8;
      local_c8 = (char *)0x0;
      local_c0._M_local_buf[0] = '\0';
      local_110 = BrightYellow;
      local_108 = 0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0 = &local_c0;
      anon_unknown_26::SummaryColumn::addRow
                ((SummaryColumn *)local_130,(totals->testCases).failedButOk);
      anon_unknown_26::SummaryColumn::addRow
                ((SummaryColumn *)local_130,(totals->assertions).failedButOk);
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::push_back((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                   *)&local_e8,(value_type *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_,local_120._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                          local_c0._M_local_buf[0]) + 1);
      }
      label.m_size = (size_type)&local_e8;
      label.m_start = (char *)0xa;
      anon_unknown_26::printSummaryRow
                ((anon_unknown_26 *)stream,(ostream *)streamColour,(ColourImpl *)0x2a2127,label,
                 (vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                  *)0x0,CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      label_00.m_size = (size_type)&local_e8;
      label_00.m_start = (char *)0xa;
      anon_unknown_26::printSummaryRow
                ((anon_unknown_26 *)stream,(ostream *)streamColour,(ColourImpl *)"assertions",
                 label_00,(vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                           *)0x1,CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      std::
      vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ::~vector((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                 *)&local_e8);
    }
    else {
      local_130._8_5_ = 0x13;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_130,stream);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"All tests passed",0x10);
      if (local_130[0xc] == true) {
        (**(code **)(*(long *)local_130._0_8_ + 0x10))(local_130._0_8_,0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream," (",2);
      local_130._0_8_ = (totals->assertions).passed;
      local_130._8_8_ = "assertion";
      local_120._M_allocated_capacity = 9;
      operator<<(stream,(pluralise *)local_130);
      std::__ostream_insert<char,std::char_traits<char>>(stream," in ",4);
      local_e8.m_count = (totals->testCases).passed;
      local_e8.m_label.m_start = "test case";
      local_e8.m_label.m_size = 9;
      operator<<(stream,&local_e8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xfffffffffffffecf,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&stack0xfffffffffffffecf,1);
    }
  }
  return;
}

Assistant:

void printTestRunTotals( std::ostream& stream,
                             ColourImpl& streamColour,
                             Totals const& totals ) {
        if ( totals.testCases.total() == 0 ) {
            stream << streamColour.guardColour( Colour::Warning )
                   << "No tests ran\n";
            return;
        }

        if ( totals.assertions.total() > 0 && totals.testCases.allPassed() ) {
            stream << streamColour.guardColour( Colour::ResultSuccess )
                   << "All tests passed";
            stream << " ("
                   << pluralise( totals.assertions.passed, "assertion"_sr )
                   << " in "
                   << pluralise( totals.testCases.passed, "test case"_sr )
                   << ')' << '\n';
            return;
        }

        std::vector<SummaryColumn> columns;
        // Don't include "skipped assertions" in total count
        const auto totalAssertionCount =
            totals.assertions.total() - totals.assertions.skipped;
        columns.push_back( SummaryColumn( "", Colour::None )
                               .addRow( totals.testCases.total() )
                               .addRow( totalAssertionCount ) );
        columns.push_back( SummaryColumn( "passed", Colour::Success )
                               .addRow( totals.testCases.passed )
                               .addRow( totals.assertions.passed ) );
        columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                               .addRow( totals.testCases.failed )
                               .addRow( totals.assertions.failed ) );
        columns.push_back( SummaryColumn( "skipped", Colour::Skip )
                               .addRow( totals.testCases.skipped )
                               // Don't print "skipped assertions"
                               .addRow( 0 ) );
        columns.push_back(
            SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                .addRow( totals.testCases.failedButOk )
                .addRow( totals.assertions.failedButOk ) );
        printSummaryRow( stream, streamColour, "test cases"_sr, columns, 0 );
        printSummaryRow( stream, streamColour, "assertions"_sr, columns, 1 );
    }